

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

LispPTR subr_gettime(LispPTR *args)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  LispPTR LVar4;
  ulong uVar5;
  timeval timev;
  timeval local_28;
  
  switch((short)*args) {
  case 0:
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    uVar3 = (int)local_28.tv_sec * 1000 +
            ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_28.tv_usec),8) >> 7) -
            (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_28.tv_usec),0xc) >> 0x1f)) +
            0xfa4cf800;
    break;
  case 1:
    uVar3 = MiscStats->starttime;
    break;
  case 2:
    update_miscstats();
    uVar3 = MiscStats->totaltime;
    break;
  case 3:
    uVar3 = MiscStats->gctime;
    break;
  case 4:
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    iVar2 = -0x7e36b500;
    goto LAB_00134bc3;
  case 5:
    gettimeofday(&local_28,(__timezone_ptr_t)0x0);
    iVar2 = 0x1c94b00;
LAB_00134bc3:
    uVar3 = iVar2 + (int)local_28.tv_sec;
    break;
  case 6:
    uVar3 = 0x62;
    break;
  case 7:
    uVar3 = 0x131;
    break;
  case 8:
    tzset();
    uVar3 = (int)(SUB168(SEXT816(0x48d159e26af37c05) * SEXT816(_timezone),8) >> 10) -
            (SUB164(SEXT816(0x48d159e26af37c05) * SEXT816(_timezone),0xc) >> 0x1f);
    break;
  default:
    uVar3 = 0;
  }
  uVar5 = (ulong)args[1];
  if (uVar5 == 0) {
    if ((uVar3 & 0xffff0000) == 0xffff0000) {
      LVar4 = uVar3 & 0xffff | 0xf0000;
    }
    else if ((uVar3 & 0xffff0000) == 0) {
      LVar4 = uVar3 | 0xe0000;
    }
    else {
      puVar1 = (uint *)createcell68k(2);
      *puVar1 = uVar3;
      if (((ulong)puVar1 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar1);
      }
      LVar4 = (LispPTR)((ulong)((long)puVar1 - (long)Lisp_world) >> 1);
    }
  }
  else {
    if ((args[1] & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
    }
    *(uint *)(Lisp_world + uVar5) = uVar3;
    LVar4 = args[1];
  }
  return LVar4;
}

Assistant:

LispPTR subr_gettime(LispPTR args[])
{
  int result;
  result = gettime(args[0] & 0xffff);
  if (args[1]) {
    *((int *)NativeAligned4FromLAddr(args[1])) = result;
    return (args[1]);
  } else
    N_ARITH_SWITCH(result);
}